

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MultiIterNext(Fts5Index *p,Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  ushort uVar1;
  uint uVar2;
  Fts5DlidxIter *pIter_00;
  Fts5Data *pFVar3;
  byte bVar4;
  int iVar5;
  ushort uVar6;
  Fts5SegIter *pIter_01;
  long in_FS_OFFSET;
  bool bVar7;
  Fts5SegIter *pSeg;
  int bNewTerm;
  Fts5SegIter *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    if (p->rc != 0) break;
    uVar1 = pIter->aFirst[1].iFirst;
    local_3c = 0;
    pIter_01 = pIter->aSeg + uVar1;
    local_48 = pIter_01;
    if ((bFrom == 0) || (pIter_00 = pIter_01->pDlidx, pIter_00 == (Fts5DlidxIter *)0x0)) {
      (*pIter_01->xNext)(p,pIter_01,&local_3c);
    }
    else {
      uVar2 = pIter_01->flags;
      if ((uVar2 & 2) == 0) {
        iVar5 = pIter_01->iLeafPgno;
        do {
          if ((pIter_00->aLvl[0].bEof != 0) || (iFrom <= pIter_00->aLvl[0].iRowid)) break;
          iVar5 = pIter_00->aLvl[0].iLeafPgno;
          fts5DlidxIterNextR(p,pIter_00,0);
        } while (p->rc == 0);
        if (iVar5 <= pIter_01->iLeafPgno) goto LAB_001e1e20;
        if (iVar5 <= pIter_01->pSeg->pgnoLast) {
          sqlite3_free(pIter_01->pNextLeaf);
          pIter_01->pNextLeaf = (Fts5Data *)0x0;
          pIter_01->iLeafPgno = iVar5 + -1;
          do {
            if (p->rc != 0) goto LAB_001e1d4c;
            fts5SegIterNextPage(p,pIter_01);
            pFVar3 = pIter_01->pLeaf;
            if (pFVar3 == (Fts5Data *)0x0) goto LAB_001e1d4c;
            uVar6 = *(ushort *)pFVar3->p;
            uVar6 = uVar6 << 8 | uVar6 >> 8;
          } while (uVar6 == 0);
          if ((3 < uVar6) && ((int)(uint)uVar6 < pFVar3->szLeaf)) {
            bVar4 = sqlite3Fts5GetVarint
                              ((uchar *)((long)pFVar3->p + (ulong)uVar6),(u64 *)&pIter_01->iRowid);
            pIter_01->iLeafOffset = (ulong)((uint)bVar4 + (uint)uVar6);
            fts5SegIterLoadNPos(p,pIter_01);
            goto LAB_001e1d4c;
          }
        }
        p->rc = 0x10b;
      }
      else {
        do {
          if ((pIter_00->aLvl[0].bEof != 0) || (pIter_00->aLvl[0].iRowid <= iFrom)) break;
          fts5DlidxIterPrevR(p,pIter_00,0);
        } while (p->rc == 0);
        iVar5 = pIter_00->aLvl[0].iLeafPgno;
        if (pIter_01->iLeafPgno <= iVar5) goto LAB_001e1e20;
        pIter_01->iLeafPgno = iVar5 + 1;
        fts5SegIterReverseNewPage(p,pIter_01);
      }
LAB_001e1d4c:
      if (pIter_01->pLeaf != (Fts5Data *)0x0) {
        if ((uVar2 & 2) == 0) {
          if (iFrom <= pIter_01->iRowid) goto LAB_001e1d7b;
        }
        else if (pIter_01->iRowid <= iFrom) goto LAB_001e1d7b;
        if (p->rc != 0) goto LAB_001e1d7b;
LAB_001e1e20:
        if (p->rc == 0) {
          (*pIter_01->xNext)(p,pIter_01,(int *)0x0);
        }
        goto LAB_001e1d4c;
      }
    }
LAB_001e1d7b:
    if (((pIter_01->pLeaf == (Fts5Data *)0x0) || (local_3c != 0)) ||
       (iVar5 = fts5MultiIterAdvanceRowid(pIter,(uint)uVar1,&local_48), iVar5 != 0)) {
      fts5MultiIterAdvanced(p,pIter,(uint)uVar1,1);
      uVar1 = pIter->aFirst[1].iFirst;
      bVar7 = pIter->aSeg[uVar1].pLeaf == (Fts5Data *)0x0;
      (pIter->base).bEof = bVar7;
      local_48 = pIter->aSeg + uVar1;
      pIter->iSwitchRowid = pIter->aSeg[uVar1].iRowid;
      if (!bVar7) goto LAB_001e1de0;
LAB_001e1e10:
      bVar7 = false;
    }
    else {
LAB_001e1de0:
      if (((pIter->bSkipEmpty == '\0') || (local_48->nPos != 0)) &&
         (iVar5 = fts5MultiIterIsDeleted(pIter), iVar5 == 0)) {
        (*pIter->xSetOutputs)(pIter,local_48);
        goto LAB_001e1e10;
      }
      bVar7 = true;
      bFrom = 0;
    }
  } while (bVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5MultiIterNext(
  Fts5Index *p,
  Fts5Iter *pIter,
  int bFrom,                      /* True if argument iFrom is valid */
  i64 iFrom                       /* Advance at least as far as this */
){
  int bUseFrom = bFrom;
  assert( pIter->base.bEof==0 );
  while( p->rc==SQLITE_OK ){
    int iFirst = pIter->aFirst[1].iFirst;
    int bNewTerm = 0;
    Fts5SegIter *pSeg = &pIter->aSeg[iFirst];
    assert( p->rc==SQLITE_OK );
    if( bUseFrom && pSeg->pDlidx ){
      fts5SegIterNextFrom(p, pSeg, iFrom);
    }else{
      pSeg->xNext(p, pSeg, &bNewTerm);
    }

    if( pSeg->pLeaf==0 || bNewTerm
     || fts5MultiIterAdvanceRowid(pIter, iFirst, &pSeg)
    ){
      fts5MultiIterAdvanced(p, pIter, iFirst, 1);
      fts5MultiIterSetEof(pIter);
      pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      if( pSeg->pLeaf==0 ) return;
    }

    fts5AssertMultiIterSetup(p, pIter);
    assert( pSeg==&pIter->aSeg[pIter->aFirst[1].iFirst] && pSeg->pLeaf );
    if( (pIter->bSkipEmpty==0 || pSeg->nPos)
      && 0==fts5MultiIterIsDeleted(pIter)
    ){
      pIter->xSetOutputs(pIter, pSeg);
      return;
    }
    bUseFrom = 0;
  }
}